

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_comment.cpp
# Opt level: O0

void __thiscall
Comment_MultiLineUnclosed_Test::~Comment_MultiLineUnclosed_Test
          (Comment_MultiLineUnclosed_Test *this)

{
  Comment_MultiLineUnclosed_Test *this_local;
  
  ~Comment_MultiLineUnclosed_Test(this);
  operator_delete(this,0x338);
  return;
}

Assistant:

TEST_F (Comment, MultiLineUnclosed) {
    using testing::_;
    EXPECT_CALL (callbacks_, null_value ()).Times (1);

    json::parser<decltype (proxy_)> p =
        json::make_parser (proxy_, json::extensions::multi_line_comments);
    p.input ("null /*comment"s).eof ();
    EXPECT_FALSE (p.has_error ()) << "JSON error was: " << p.last_error ().message ();
    EXPECT_EQ (p.coordinate (), (json::coord{15, 1}));
}